

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property_attribute.h
# Opt level: O1

bool mjs::has_attributes(property_attribute attributes,property_attribute check)

{
  if (attributes < (invalid|read_only)) {
    if (attributes != invalid) {
      if (invalid < check) goto LAB_00123858;
      if ((check & ~invalid) != none) {
        return (check & ~attributes) == none;
      }
    }
    __assert_fail("is_valid(attributes) && is_valid(check) && check != property_attribute::none",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/property_attribute.h"
                  ,0x2e,"bool mjs::has_attributes(property_attribute, property_attribute)");
  }
LAB_00123858:
  __assert_fail("static_cast<unsigned>(a) <= static_cast<unsigned>(property_attribute::invalid)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/property_attribute.h"
                ,0x24,"bool mjs::is_valid(property_attribute)");
}

Assistant:

constexpr bool has_attributes(property_attribute attributes, property_attribute check) {
    assert(is_valid(attributes) && is_valid(check) && check != property_attribute::none);
    return (attributes & check) == check;
}